

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O2

void testMagic(string *param_1)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing magic number");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_19178f::testFile1
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_none.exr"
             ,true);
  anon_unknown.dwarf_19178f::testFile1
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/invalid.exr"
             ,false);
  anon_unknown.dwarf_19178f::testFile2
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/tiled.exr"
             ,true,true,true);
  anon_unknown.dwarf_19178f::testFile2
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/comp_none.exr"
             ,true,true,false);
  anon_unknown.dwarf_19178f::testFile2
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/invalid.exr"
             ,true,false,false);
  anon_unknown.dwarf_19178f::testFile2
            ("/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/does_not_exist.exr"
             ,false,false,false);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testMagic (const std::string&)
{
    try
    {
        cout << "Testing magic number" << endl;

        testFile1 (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", true);
        testFile1 (ILM_IMF_TEST_IMAGEDIR "invalid.exr", false);

        testFile2 (ILM_IMF_TEST_IMAGEDIR "tiled.exr", true, true, true);
        testFile2 (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", true, true, false);
        testFile2 (ILM_IMF_TEST_IMAGEDIR "invalid.exr", true, false, false);
        testFile2 (
            ILM_IMF_TEST_IMAGEDIR "does_not_exist.exr", false, false, false);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}